

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestRegistry::getMatchingTestCases
          (TestRegistry *this,string *rawTestSpec,
          vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestsOut)

{
  bool bVar1;
  TestCase *in_RDX;
  value_type *in_RDI;
  const_iterator itEnd;
  const_iterator it;
  TestCaseFilter filter;
  DoWhat in_stack_00000124;
  string *in_stack_00000128;
  TestCaseFilter *in_stack_00000130;
  TestCase *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_48 [6];
  TestCase *local_18;
  
  local_18 = in_RDX;
  TestCaseFilter::TestCaseFilter(in_stack_00000130,in_stack_00000128,in_stack_00000124);
  local_48[0]._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 (in_stack_ffffffffffffff88);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_ffffffffffffff88)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                            (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator*(local_48);
    in_stack_ffffffffffffff97 =
         TestCaseFilter::shouldInclude
                   ((TestCaseFilter *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
    if ((bool)in_stack_ffffffffffffff97) {
      in_stack_ffffffffffffff88 = local_18;
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
      ::operator*(local_48);
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                (in_stack_ffffffffffffffa0,in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(local_48);
  }
  TestCaseFilter::~TestCaseFilter((TestCaseFilter *)0x1a6f48);
  return;
}

Assistant:

virtual void getMatchingTestCases( std::string const& rawTestSpec, std::vector<TestCase>& matchingTestsOut ) const {
            TestCaseFilter filter( rawTestSpec );

            std::vector<TestCase>::const_iterator it = m_functionsInOrder.begin();
            std::vector<TestCase>::const_iterator itEnd = m_functionsInOrder.end();
            for(; it != itEnd; ++it ) {
                if( filter.shouldInclude( *it ) ) {
                    matchingTestsOut.push_back( *it );
                }
            }
        }